

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O2

int sfp_get_temp(tcv_t *tcv,int16_t *temp)

{
  en_calibration_type eVar1;
  int iVar2;
  int16_t val;
  
  eVar1 = sfp_dd_type(tcv);
  iVar2 = (*(code *)(&DAT_00106010 + *(int *)(&DAT_00106010 + (ulong)eVar1 * 4)))();
  return iVar2;
}

Assistant:

static int sfp_get_temp(tcv_t *tcv, int16_t* temp)
{
	int16_t val=0;
	int err = 0;

	en_calibration_type calib;

	calib = sfp_dd_type(tcv);

	switch (calib) {
		case DD_UNAVAILABLE:
			err = TCV_ERR_DIAGNOSTICS_INFO_NOT_PRESENT;
			break;
		case DD_CALIB_INTERNAL:
			err = get_short_ad_val(tcv, DD_TEMP_AD_REG, &val);
			break;
		case DD_CALIB_EXTERNAL:
			err = get_temp_calib_f8(tcv, &val);
			break;
		default:
			err = TCV_ERR_GENERIC;
	}
	if (err < 0)
		return err;

	*temp = (int16_t) val;
	return 0;
}